

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonSplitFormatter.cpp
# Opt level: O0

ostream * __thiscall
cali::JsonSplitFormatter::JsonSplitFormatterImpl::write_column_metadata
          (JsonSplitFormatterImpl *this,ostream *os,Column *column,
          CaliperMetadataAccessInterface *db)

{
  int iVar1;
  ostream *poVar2;
  size_type sVar3;
  const_reference this_00;
  cali_id_t cVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar5;
  bool bVar6;
  cali_variant_t local_a0;
  string local_90;
  allocator<char> local_59;
  string local_58;
  Attribute local_38;
  Attribute attr;
  Node *node;
  CaliperMetadataAccessInterface *db_local;
  Column *column_local;
  ostream *os_local;
  JsonSplitFormatterImpl *this_local;
  
  poVar2 = std::operator<<(os,"\"is_value\": ");
  pcVar5 = "true";
  if ((column->is_hierarchy & 1U) != 0) {
    pcVar5 = "false";
  }
  std::operator<<(poVar2,pcVar5);
  sVar3 = std::vector<cali::Attribute,_std::allocator<cali::Attribute>_>::size(&column->attributes);
  if (sVar3 == 1) {
    this_00 = std::vector<cali::Attribute,_std::allocator<cali::Attribute>_>::front
                        (&column->attributes);
    cVar4 = Attribute::id(this_00);
    iVar1 = (**db->_vptr_CaliperMetadataAccessInterface)(db,cVar4);
    attr.m_node = (Node *)CONCAT44(extraout_var,iVar1);
    if (attr.m_node != (Node *)0x0) {
      attr.m_node = util::LockfreeIntrusiveTree<cali::Node>::parent
                              ((LockfreeIntrusiveTree<cali::Node> *)attr.m_node);
    }
    while( true ) {
      bVar6 = false;
      if (attr.m_node != (Node *)0x0) {
        cVar4 = Node::id(attr.m_node);
        bVar6 = cVar4 != 0xffffffffffffffff;
      }
      if (!bVar6) break;
      cVar4 = Node::attribute(attr.m_node);
      iVar1 = (*db->_vptr_CaliperMetadataAccessInterface[1])(db,cVar4);
      local_38.m_node = (Node *)CONCAT44(extraout_var_00,iVar1);
      cVar4 = Attribute::id(&local_38);
      if ((0xb < cVar4) && (bVar6 = Attribute::is_hidden(&local_38), !bVar6)) {
        poVar2 = std::operator<<(os,", \"");
        pcVar5 = Attribute::name_c_str(&local_38);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,pcVar5,&local_59);
        poVar2 = util::write_json_esc_string(poVar2,&local_58);
        std::operator<<(poVar2,"\": ");
        std::__cxx11::string::~string((string *)&local_58);
        std::allocator<char>::~allocator(&local_59);
        poVar2 = std::operator<<(os,"\"");
        local_a0 = (cali_variant_t)Node::data(attr.m_node);
        Variant::to_string_abi_cxx11_(&local_90,(Variant *)&local_a0);
        poVar2 = util::write_json_esc_string(poVar2,&local_90);
        std::operator<<(poVar2,"\"");
        std::__cxx11::string::~string((string *)&local_90);
      }
      attr.m_node = util::LockfreeIntrusiveTree<cali::Node>::parent
                              (&(attr.m_node)->super_LockfreeIntrusiveTree<cali::Node>);
    }
  }
  return os;
}

Assistant:

std::ostream& write_column_metadata(std::ostream& os, const Column& column, CaliperMetadataAccessInterface& db)
    {
        os << "\"is_value\": " << (column.is_hierarchy ? "false" : "true");

        // for single-attribute columns (i.e. not "path"), write metadata
        if (column.attributes.size() == 1) {
            const Node* node = db.node(column.attributes.front().id());

            if (node)
                node = node->parent();

            for (; node && node->id() != CALI_INV_ID; node = node->parent()) {
                Attribute attr = db.get_attribute(node->attribute());

                // skip bootstrap info and hidden attributes
                if (attr.id() < 12 || attr.is_hidden())
                    continue;

                util::write_json_esc_string(os << ", \"", attr.name_c_str()) << "\": ";
                util::write_json_esc_string(os << "\"", node->data().to_string()) << "\"";
            }
        }

        return os;
    }